

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNNode<unsigned_char>::import_transitions
          (CATNNode<unsigned_char> *this,NFAState<unsigned_char> *state,int offset)

{
  pointer pNVar1;
  pointer this_00;
  NFATransition<unsigned_char> local_60;
  
  pNVar1 = (state->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (state->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1
      ) {
    NFATransition<unsigned_char>::offset(&local_60,this_00,offset);
    std::
    vector<Centaurus::NFATransition<unsigned_char>,std::allocator<Centaurus::NFATransition<unsigned_char>>>
    ::emplace_back<Centaurus::NFATransition<unsigned_char>>
              ((vector<Centaurus::NFATransition<unsigned_char>,std::allocator<Centaurus::NFATransition<unsigned_char>>>
                *)&this->m_transitions,&local_60);
    NFATransition<unsigned_char>::~NFATransition(&local_60);
  }
  return;
}

Assistant:

void import_transitions(const NFAState<TCHAR>& state, int offset)
    {
        for (const auto& tr : state.get_transitions())
        {
            m_transitions.push_back(tr.offset(offset));
        }
    }